

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::z_formatter
          (z_formatter<spdlog::details::scoped_padder> *this,padding_info padinfo)

{
  padding_info padinfo_00;
  undefined8 in_RDX;
  size_t in_RSI;
  flag_formatter *in_RDI;
  flag_formatter *this_00;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb0;
  int local_3c;
  duration<long,std::ratio<1l,1l>> local_38 [8];
  duration local_30 [6];
  
  padinfo_00._8_8_ = in_RDX;
  padinfo_00.width_ = in_RSI;
  flag_formatter::flag_formatter(in_RDI,padinfo_00);
  in_RDI->_vptr_flag_formatter = (_func_int **)&PTR__z_formatter_009316c0;
  this_00 = in_RDI + 1;
  local_3c = 0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_38,&local_3c);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (in_stack_ffffffffffffffb0,(duration<long,_std::ratio<1L,_1L>_> *)this_00);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this_00,local_30);
  *(undefined4 *)&in_RDI[1].padinfo_.width_ = 0;
  return;
}

Assistant:

explicit z_formatter(padding_info padinfo)
        : flag_formatter(padinfo) {}